

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

void bench_ecmult_multi(void *arg,int iters)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  uVar2 = *(ulong *)((long)arg + 0x40);
  uVar6 = (uint)((ulong)(long)iters / uVar2);
  if (0 < (int)uVar6) {
    iVar1 = *(int *)((long)arg + 0x48);
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (*(int *)((long)arg + 0x48) == 0) {
        lVar3 = 0;
      }
      else {
        lVar3 = *(long *)((long)arg + 0x50) * 0x20 + *(long *)((long)arg + 0x10);
      }
      (**(code **)((long)arg + 0x38))
                (*arg + 0xb8,*(undefined8 *)((long)arg + 8),*(long *)((long)arg + 0x60) + lVar5,
                 lVar3,bench_ecmult_multi_callback,arg,(long)(int)uVar2 - (long)iVar1);
      *(ulong *)((long)arg + 0x50) = *(long *)((long)arg + 0x50) + uVar2 & 0x7fff;
      *(ulong *)((long)arg + 0x58) = *(long *)((long)arg + 0x58) + uVar2 + 0x7fff & 0x7fff;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x80;
    } while (uVar4 < (uVar6 & 0x7fffffff));
  }
  return;
}

Assistant:

static void bench_ecmult_multi(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;

    int includes_g = data->includes_g;
    int iter;
    int count = data->count;
    iters = iters / data->count;

    for (iter = 0; iter < iters; ++iter) {
        data->ecmult_multi(&data->ctx->error_callback, data->scratch, &data->output[iter], data->includes_g ? &data->scalars[data->offset1] : NULL, bench_ecmult_multi_callback, arg, count - includes_g);
        data->offset1 = (data->offset1 + count) % POINTS;
        data->offset2 = (data->offset2 + count - 1) % POINTS;
    }
}